

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmp_examples.cpp
# Opt level: O1

void clear_memory(TRIPLEYCbCr **mrx,int h)

{
  ulong uVar1;
  
  if (0 < h) {
    uVar1 = 0;
    do {
      if (mrx[uVar1] != (TRIPLEYCbCr *)0x0) {
        operator_delete__(mrx[uVar1]);
      }
      uVar1 = uVar1 + 1;
    } while ((uint)h != uVar1);
  }
  if (mrx != (TRIPLEYCbCr **)0x0) {
    operator_delete__(mrx);
    return;
  }
  return;
}

Assistant:

void clear_memory(TRIPLEYCbCr **mrx, int h) {
    for (int i = 0; i < h; i++)
        delete[] mrx[i];
    delete[] mrx;
}